

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerStream.cpp
# Opt level: O2

WorkerFlow * __thiscall
WorkerStream::create_flow(WorkerStream *this,string *name,string *connect,int port,size_t buffsize)

{
  WorkerFlow *this_00;
  mapped_type pWVar1;
  mapped_type *ppWVar2;
  string local_50;
  
  this_00 = (WorkerFlow *)operator_new(0x38);
  std::__cxx11::string::string((string *)&local_50,(string *)connect);
  WorkerFlow::WorkerFlow(this_00,&local_50,port,buffsize);
  std::__cxx11::string::~string((string *)&local_50);
  pWVar1 = (mapped_type)operator_new(0x10);
  pWVar1->flow = this_00;
  pWVar1->stopped = false;
  ppWVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*>_>_>
            ::operator[](&this->m_flows,name);
  *ppWVar2 = pWVar1;
  return this_00;
}

Assistant:

WorkerFlow * WorkerStream::create_flow(std::string name, std::string connect, int port,
    size_t buffsize)
{
    // create the flow.
    WorkerFlow * flow = new WorkerFlow(connect, port, buffsize);

    // wrap the flow with additional meta-data.
    WorkerWrapper * wd = new WorkerWrapper;
    wd->flow = flow;
    wd->stopped = false;

    // register the flow.
    m_flows[name] = wd;

    return flow;
}